

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

void __thiscall tlx::SpacingLogger::~SpacingLogger(SpacingLogger *this)

{
  __pointer_type pLVar1;
  string local_40 [48];
  SpacingLogger *local_10;
  SpacingLogger *this_local;
  
  local_10 = this;
  std::operator<<((ostream *)&this->oss_,'\n');
  pLVar1 = std::atomic::operator_cast_to_LoggerOutputHook_((atomic *)&s_logger_output_hook);
  std::__cxx11::ostringstream::str();
  (*pLVar1->_vptr_LoggerOutputHook[2])(pLVar1,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->oss_);
  return;
}

Assistant:

SpacingLogger::~SpacingLogger() {
    oss_ << '\n';
    (*s_logger_output_hook).append_log_line(oss_.str());
}